

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_helper.h
# Opt level: O2

void serialization::unserialize_helper<serialization::xml_iarchive,int>
               (xml_iarchive *ar,vector<int,_std::allocator<int>_> *v)

{
  size_type sVar1;
  size_type i;
  size_type i_00;
  int tmp;
  int local_2c;
  
  sVar1 = xml_iarchive::load_sequence_start(ar);
  std::vector<int,_std::allocator<int>_>::reserve(v,(ulong)sVar1);
  for (i_00 = 0; sVar1 != i_00; i_00 = i_00 + 1) {
    xml_iarchive::load_sequence_item_start(ar,i_00);
    xml_iarchive::load<int>(ar,&local_2c);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(v,&local_2c);
    xml_iarchive::load_sequence_item_end(ar);
  }
  xml_iarchive::load_sequence_end(ar);
  return;
}

Assistant:

inline void unserialize_helper(const Archive & ar, std::vector<T> & v)
{
	serialization_trace trace(__func__, __FILE__, __LINE__);

    auto size = ar.load_sequence_start();
    v.reserve(size);
    for(size_type i = 0; i < size; ++i)
    {
        ar.load_sequence_item_start(i);
        T tmp;
        unserialize_helper(ar, tmp);
        v.push_back(std::move(tmp));
        ar.load_sequence_item_end();
    }

    ar.load_sequence_end();
}